

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void __thiscall
ConvexDecomposition::ConvexH::ConvexH
          (ConvexH *this,int vertices_size,int edges_size,int facets_size)

{
  Array<ConvexDecomposition::float3>::Array(&this->vertices,vertices_size);
  Array<ConvexDecomposition::ConvexH::HalfEdge>::Array(&this->edges,edges_size);
  Array<ConvexDecomposition::Plane>::Array(&this->facets,facets_size);
  (this->vertices).count = vertices_size;
  (this->edges).count = edges_size;
  (this->facets).count = facets_size;
  return;
}

Assistant:

ConvexH::ConvexH(int vertices_size,int edges_size,int facets_size)
	:vertices(vertices_size)
	,edges(edges_size)
	,facets(facets_size)
{
	vertices.count=vertices_size;
	edges.count   = edges_size;
	facets.count  = facets_size;
}